

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O2

void __thiscall
CLI::IsMember::IsMember<char_const*>(IsMember *this,initializer_list<const_char_*> values)

{
  allocator_type local_29;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_28;
  
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_28,values,&local_29);
  IsMember<std::vector<char_const*,std::allocator<char_const*>>>
            (this,(vector<const_char_*,_std::allocator<const_char_*>_> *)&local_28);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_28);
  return;
}

Assistant:

IsMember(std::initializer_list<T> values, Args &&...args)
        : IsMember(std::vector<T>(values), std::forward<Args>(args)...) {}